

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_kernel_2.h
# Opt level: O0

void __thiscall
dlib::
sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
::add(sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
      *this,unsigned_long pos,
     unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_> *item)

{
  node *pnVar1;
  node *a;
  unsigned_long in_RSI;
  sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_RDI;
  node *c_node_1;
  node *n_node_1;
  node *c_node;
  node *n_node;
  node *new_node;
  unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>
  *in_stack_ffffffffffffffa8;
  
  a = (node *)operator_new(0x18);
  node::node((node *)0x486594);
  exchange<std::unique_ptr<dlib::toggle_button,std::default_delete<dlib::toggle_button>>>
            (&a->item,in_stack_ffffffffffffffa8);
  if (in_RDI->sequence_size == 0) {
    in_RDI->current_pos = 0;
    a->left = a;
    a->right = a;
  }
  else if (in_RSI == in_RDI->sequence_size) {
    move_to_pos(in_RDI,&in_RDI->current_node,&in_RDI->current_pos,in_RSI - 1,in_RDI->sequence_size);
    pnVar1 = in_RDI->current_node;
    a->right = pnVar1->right;
    a->left = in_RDI->current_node;
    pnVar1->right->left = a;
    pnVar1->right = a;
    in_RDI->current_pos = in_RSI;
  }
  else {
    move_to_pos(in_RDI,&in_RDI->current_node,&in_RDI->current_pos,in_RSI,in_RDI->sequence_size);
    pnVar1 = in_RDI->current_node;
    a->right = in_RDI->current_node;
    a->left = pnVar1->left;
    pnVar1->left->right = a;
    pnVar1->left = a;
  }
  in_RDI->current_node = a;
  in_RDI->sequence_size = in_RDI->sequence_size + 1;
  (*(in_RDI->
    super_enumerable<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>_>
    )._vptr_enumerable[3])();
  return;
}

Assistant:

void sequence_kernel_2<T,mem_manager>::
    add (
        unsigned long pos,
        T& item
    )
    {
        // make new node and swap item into it
        node* new_node = new node;
        exchange(item,new_node->item);

        if (sequence_size > 0)
        {
            if (pos == sequence_size)
            {
                move_to_pos(current_node,current_pos,pos-1,sequence_size);
                
                node& n_node = *new_node;
                node& c_node = *current_node;

                // make new node point to the nodes to its left and right
                n_node.right = c_node.right;
                n_node.left  = current_node;

                // make the left node point back to new_node
                c_node.right->left = new_node;

                // make the right node point back to new_node
                c_node.right = new_node;
                current_pos = pos;

            }
            else
            {
                move_to_pos(current_node,current_pos,pos,sequence_size);

                node& n_node = *new_node;
                node& c_node = *current_node;

                // make new node point to the nodes to its left and right
                n_node.right = current_node;
                n_node.left  = c_node.left;

                // make the left node point back to new_node
                c_node.left->right = new_node;

                // make the right node point back to new_node
                c_node.left = new_node;
            }
            
        }
        else
        {
            current_pos = 0;
            new_node->left = new_node;
            new_node->right = new_node;
        }

        // make the new node the current node
        current_node = new_node;    
    
        ++sequence_size;
        // reset the enumerator
        reset();
    }